

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void CollectHistogram_SSE2
               (uint8_t *ref,uint8_t *pred,int start_block,int end_block,VP8Histogram *histo)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int in_ECX;
  int in_EDX;
  VP8Histogram *in_R8;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i bin1;
  __m128i bin0;
  __m128i v1;
  __m128i v0;
  __m128i abs1;
  __m128i abs0;
  __m128i d1;
  __m128i d0;
  __m128i out1;
  __m128i out0;
  int k;
  int16_t out [16];
  int distribution [32];
  int j;
  __m128i max_coeff_thresh;
  __m128i zero;
  int local_28c;
  undefined8 local_288;
  undefined8 uStackY_280;
  undefined8 local_278;
  undefined8 uStackY_270;
  int local_268 [28];
  int16_t *in_stack_fffffffffffffe08;
  uint8_t *in_stack_fffffffffffffe10;
  uint8_t *in_stack_fffffffffffffe18;
  int local_1dc;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  
  memset(local_268,0,0x80);
  for (local_1dc = in_EDX; local_1dc < in_ECX; local_1dc = local_1dc + 1) {
    FTransform_SSE2(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_148 = (short)local_288;
    sStack_146 = (short)((ulong)local_288 >> 0x10);
    sStack_144 = (short)((ulong)local_288 >> 0x20);
    sStack_142 = (short)((ulong)local_288 >> 0x30);
    sStack_140 = (short)uStackY_280;
    sStack_13e = (short)((ulong)uStackY_280 >> 0x10);
    sStack_13c = (short)((ulong)uStackY_280 >> 0x20);
    sStack_13a = (short)((ulong)uStackY_280 >> 0x30);
    sVar1 = -local_148;
    sVar2 = -sStack_146;
    sVar3 = -sStack_144;
    sVar4 = -sStack_142;
    sVar5 = -sStack_140;
    sVar6 = -sStack_13e;
    sVar7 = -sStack_13c;
    sVar8 = -sStack_13a;
    local_168 = (short)local_278;
    sStack_166 = (short)((ulong)local_278 >> 0x10);
    sStack_164 = (short)((ulong)local_278 >> 0x20);
    sStack_162 = (short)((ulong)local_278 >> 0x30);
    sStack_160 = (short)uStackY_270;
    sStack_15e = (short)((ulong)uStackY_270 >> 0x10);
    sStack_15c = (short)((ulong)uStackY_270 >> 0x20);
    sStack_15a = (short)((ulong)uStackY_270 >> 0x30);
    sVar9 = -local_168;
    sVar10 = -sStack_166;
    sVar11 = -sStack_164;
    sVar12 = -sStack_162;
    sVar13 = -sStack_160;
    sVar14 = -sStack_15e;
    sVar15 = -sStack_15c;
    sVar16 = -sStack_15a;
    auVar17._2_2_ =
         (ushort)(sStack_146 < sVar2) * sVar2 | (ushort)(sStack_146 >= sVar2) * sStack_146;
    auVar17._0_2_ = (ushort)(local_148 < sVar1) * sVar1 | (ushort)(local_148 >= sVar1) * local_148;
    auVar17._4_2_ =
         (ushort)(sStack_144 < sVar3) * sVar3 | (ushort)(sStack_144 >= sVar3) * sStack_144;
    auVar17._6_2_ =
         (ushort)(sStack_142 < sVar4) * sVar4 | (ushort)(sStack_142 >= sVar4) * sStack_142;
    auVar17._10_2_ =
         (ushort)(sStack_13e < sVar6) * sVar6 | (ushort)(sStack_13e >= sVar6) * sStack_13e;
    auVar17._8_2_ =
         (ushort)(sStack_140 < sVar5) * sVar5 | (ushort)(sStack_140 >= sVar5) * sStack_140;
    auVar17._12_2_ =
         (ushort)(sStack_13c < sVar7) * sVar7 | (ushort)(sStack_13c >= sVar7) * sStack_13c;
    auVar17._14_2_ =
         (ushort)(sStack_13a < sVar8) * sVar8 | (ushort)(sStack_13a >= sVar8) * sStack_13a;
    auVar17 = psraw(auVar17,ZEXT416(3));
    auVar18._2_2_ =
         (ushort)(sStack_166 < sVar10) * sVar10 | (ushort)(sStack_166 >= sVar10) * sStack_166;
    auVar18._0_2_ = (ushort)(local_168 < sVar9) * sVar9 | (ushort)(local_168 >= sVar9) * local_168;
    auVar18._4_2_ =
         (ushort)(sStack_164 < sVar11) * sVar11 | (ushort)(sStack_164 >= sVar11) * sStack_164;
    auVar18._6_2_ =
         (ushort)(sStack_162 < sVar12) * sVar12 | (ushort)(sStack_162 >= sVar12) * sStack_162;
    auVar18._10_2_ =
         (ushort)(sStack_15e < sVar14) * sVar14 | (ushort)(sStack_15e >= sVar14) * sStack_15e;
    auVar18._8_2_ =
         (ushort)(sStack_160 < sVar13) * sVar13 | (ushort)(sStack_160 >= sVar13) * sStack_160;
    auVar18._12_2_ =
         (ushort)(sStack_15c < sVar15) * sVar15 | (ushort)(sStack_15c >= sVar15) * sStack_15c;
    auVar18._14_2_ =
         (ushort)(sStack_15a < sVar16) * sVar16 | (ushort)(sStack_15a >= sVar16) * sStack_15a;
    auVar18 = psraw(auVar18,ZEXT416(3));
    local_78 = auVar17._0_2_;
    sStack_76 = auVar17._2_2_;
    sStack_74 = auVar17._4_2_;
    sStack_72 = auVar17._6_2_;
    sStack_70 = auVar17._8_2_;
    sStack_6e = auVar17._10_2_;
    sStack_6c = auVar17._12_2_;
    sStack_6a = auVar17._14_2_;
    local_98 = auVar18._0_2_;
    sStack_96 = auVar18._2_2_;
    sStack_94 = auVar18._4_2_;
    sStack_92 = auVar18._6_2_;
    sStack_90 = auVar18._8_2_;
    sStack_8e = auVar18._10_2_;
    sStack_8c = auVar18._12_2_;
    sStack_8a = auVar18._14_2_;
    local_288 = CONCAT26((ushort)(0x1f < sStack_72) * 0x1f | (ushort)(0x1f >= sStack_72) * sStack_72
                         ,CONCAT24((ushort)(0x1f < sStack_74) * 0x1f |
                                   (ushort)(0x1f >= sStack_74) * sStack_74,
                                   CONCAT22((ushort)(0x1f < sStack_76) * 0x1f |
                                            (ushort)(0x1f >= sStack_76) * sStack_76,
                                            (ushort)(0x1f < local_78) * 0x1f |
                                            (ushort)(0x1f >= local_78) * local_78)));
    uStackY_280 = CONCAT26((ushort)(0x1f < sStack_6a) * 0x1f |
                           (ushort)(0x1f >= sStack_6a) * sStack_6a,
                           CONCAT24((ushort)(0x1f < sStack_6c) * 0x1f |
                                    (ushort)(0x1f >= sStack_6c) * sStack_6c,
                                    CONCAT22((ushort)(0x1f < sStack_6e) * 0x1f |
                                             (ushort)(0x1f >= sStack_6e) * sStack_6e,
                                             (ushort)(0x1f < sStack_70) * 0x1f |
                                             (ushort)(0x1f >= sStack_70) * sStack_70)));
    local_278 = CONCAT26((ushort)(0x1f < sStack_92) * 0x1f | (ushort)(0x1f >= sStack_92) * sStack_92
                         ,CONCAT24((ushort)(0x1f < sStack_94) * 0x1f |
                                   (ushort)(0x1f >= sStack_94) * sStack_94,
                                   CONCAT22((ushort)(0x1f < sStack_96) * 0x1f |
                                            (ushort)(0x1f >= sStack_96) * sStack_96,
                                            (ushort)(0x1f < local_98) * 0x1f |
                                            (ushort)(0x1f >= local_98) * local_98)));
    uStackY_270 = CONCAT26((ushort)(0x1f < sStack_8a) * 0x1f |
                           (ushort)(0x1f >= sStack_8a) * sStack_8a,
                           CONCAT24((ushort)(0x1f < sStack_8c) * 0x1f |
                                    (ushort)(0x1f >= sStack_8c) * sStack_8c,
                                    CONCAT22((ushort)(0x1f < sStack_8e) * 0x1f |
                                             (ushort)(0x1f >= sStack_8e) * sStack_8e,
                                             (ushort)(0x1f < sStack_90) * 0x1f |
                                             (ushort)(0x1f >= sStack_90) * sStack_90)));
    for (local_28c = 0; local_28c < 0x10; local_28c = local_28c + 1) {
      sVar1 = *(short *)((long)&local_288 + (long)local_28c * 2);
      local_268[sVar1] = local_268[sVar1] + 1;
    }
  }
  VP8SetHistogramData(local_268,in_R8);
  return;
}

Assistant:

static void CollectHistogram_SSE2(const uint8_t* WEBP_RESTRICT ref,
                                  const uint8_t* WEBP_RESTRICT pred,
                                  int start_block, int end_block,
                                  VP8Histogram* WEBP_RESTRICT const histo) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i max_coeff_thresh = _mm_set1_epi16(MAX_COEFF_THRESH);
  int j;
  int distribution[MAX_COEFF_THRESH + 1] = { 0 };
  for (j = start_block; j < end_block; ++j) {
    int16_t out[16];
    int k;

    FTransform_SSE2(ref + VP8DspScan[j], pred + VP8DspScan[j], out);

    // Convert coefficients to bin (within out[]).
    {
      // Load.
      const __m128i out0 = _mm_loadu_si128((__m128i*)&out[0]);
      const __m128i out1 = _mm_loadu_si128((__m128i*)&out[8]);
      const __m128i d0 = _mm_sub_epi16(zero, out0);
      const __m128i d1 = _mm_sub_epi16(zero, out1);
      const __m128i abs0 = _mm_max_epi16(out0, d0);   // abs(v), 16b
      const __m128i abs1 = _mm_max_epi16(out1, d1);
      // v = abs(out) >> 3
      const __m128i v0 = _mm_srai_epi16(abs0, 3);
      const __m128i v1 = _mm_srai_epi16(abs1, 3);
      // bin = min(v, MAX_COEFF_THRESH)
      const __m128i bin0 = _mm_min_epi16(v0, max_coeff_thresh);
      const __m128i bin1 = _mm_min_epi16(v1, max_coeff_thresh);
      // Store.
      _mm_storeu_si128((__m128i*)&out[0], bin0);
      _mm_storeu_si128((__m128i*)&out[8], bin1);
    }

    // Convert coefficients to bin.
    for (k = 0; k < 16; ++k) {
      ++distribution[out[k]];
    }
  }
  VP8SetHistogramData(distribution, histo);
}